

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

QStringList * __thiscall
QCommandLineParser::positionalArguments
          (QStringList *__return_storage_ptr__,QCommandLineParser *this)

{
  QCommandLineParserPrivate::checkParsed(this->d,"positionalArguments");
  QArrayDataPointer<QString>::QArrayDataPointer
            (&__return_storage_ptr__->d,&(this->d->positionalArgumentList).d);
  return __return_storage_ptr__;
}

Assistant:

QStringList QCommandLineParser::positionalArguments() const
{
    d->checkParsed("positionalArguments");
    return d->positionalArgumentList;
}